

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dominator.cpp
# Opt level: O1

void __thiscall
dominator::dfs(dominator *this,BasicBlock *bb,
              set<BasicBlock_*,_std::less<BasicBlock_*>,_std::allocator<BasicBlock_*>_> *visited,
              int *id)

{
  _Rb_tree_header *p_Var1;
  size_t *psVar2;
  int iVar3;
  BasicBlock *bb_00;
  _Base_ptr p_Var4;
  _Base_ptr p_Var5;
  mapped_type *pmVar6;
  _List_node_base *p_Var7;
  _Rb_tree_header *p_Var8;
  list<BasicBlock_*,_std::allocator<BasicBlock_*>_> *plVar9;
  BasicBlock *local_38;
  
  local_38 = bb;
  std::
  _Rb_tree<BasicBlock*,BasicBlock*,std::_Identity<BasicBlock*>,std::less<BasicBlock*>,std::allocator<BasicBlock*>>
  ::_M_insert_unique<BasicBlock*const&>
            ((_Rb_tree<BasicBlock*,BasicBlock*,std::_Identity<BasicBlock*>,std::less<BasicBlock*>,std::allocator<BasicBlock*>>
              *)visited,&local_38);
  p_Var7 = (local_38->succ_bbs_).super__List_base<BasicBlock_*,_std::allocator<BasicBlock_*>_>.
           _M_impl._M_node.super__List_node_base._M_next;
  plVar9 = &local_38->succ_bbs_;
  if (p_Var7 != (_List_node_base *)plVar9) {
    p_Var1 = &(visited->_M_t)._M_impl.super__Rb_tree_header;
    do {
      bb_00 = (BasicBlock *)p_Var7[1]._M_next;
      if (bb_00->_fake == false) {
        p_Var4 = (visited->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var5 = &p_Var1->_M_header;
        for (; (_Rb_tree_header *)p_Var4 != (_Rb_tree_header *)0x0;
            p_Var4 = (&p_Var4->_M_left)[*(BasicBlock **)(p_Var4 + 1) < bb_00]) {
          if (*(BasicBlock **)(p_Var4 + 1) >= bb_00) {
            p_Var5 = p_Var4;
          }
        }
        p_Var8 = p_Var1;
        if (((_Rb_tree_header *)p_Var5 != p_Var1) &&
           (p_Var8 = (_Rb_tree_header *)p_Var5,
           bb_00 < (BasicBlock *)((_Rb_tree_header *)p_Var5)->_M_node_count)) {
          p_Var8 = p_Var1;
        }
        if (p_Var8 == p_Var1) {
          dfs(this,bb_00,visited,id);
        }
      }
      p_Var7 = p_Var7->_M_next;
    } while (p_Var7 != (_List_node_base *)plVar9);
  }
  iVar3 = *id;
  *id = iVar3 + 1;
  pmVar6 = std::
           map<BasicBlock_*,_int,_std::less<BasicBlock_*>,_std::allocator<std::pair<BasicBlock_*const,_int>_>_>
           ::operator[](&this->_postOrderID,&local_38);
  *pmVar6 = iVar3;
  p_Var7 = (_List_node_base *)operator_new(0x18);
  p_Var7[1]._M_next = (_List_node_base *)local_38;
  std::__detail::_List_node_base::_M_hook(p_Var7);
  psVar2 = &(this->_reversedPostOrderQueue).
            super__List_base<BasicBlock_*,_std::allocator<BasicBlock_*>_>._M_impl._M_node._M_size;
  *psVar2 = *psVar2 + 1;
  return;
}

Assistant:

void dominator::dfs(BasicBlock *bb, std::set<BasicBlock *> &visited, int &id){
    visited.insert(bb);
    for (auto _bb : bb->get_succ_basic_blocks()) {
        // 跳过假块
        if(_bb->is_fake_block()) continue;
        // 若没有访问过则对其访问，否则跳过
        if (visited.find(_bb) == visited.end()) {
            dfs(_bb, visited, id);
        }
    }
    _postOrderID[bb] = id++;
    _reversedPostOrderQueue.push_back(bb);
}